

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_9_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 *puVar1;
  float fVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined8 *local_6a8;
  undefined8 *local_690;
  int *local_688;
  float fStack_4dc;
  float fStack_4d0;
  float fStack_4c4;
  float local_4b8;
  float fStack_49c;
  float fStack_490;
  float fStack_484;
  float local_478;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  
  local_6a8 = in_RDI;
  local_690 = in_R8;
  local_688 = in_RCX;
  do {
    puVar1 = (undefined8 *)(in_RDX + (long)(*local_688 * 7) * 4);
    local_478 = (float)*local_690;
    local_248 = (float)*puVar1;
    fStack_244 = (float)((ulong)*puVar1 >> 0x20);
    fStack_240 = (float)puVar1[1];
    fStack_23c = (float)((ulong)puVar1[1] >> 0x20);
    local_268 = (float)*(undefined8 *)((long)puVar1 + 0xc);
    fStack_264 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc) >> 0x20);
    fStack_260 = (float)*(undefined8 *)((long)puVar1 + 0x14);
    fStack_25c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x14) >> 0x20);
    fStack_484 = (float)((ulong)*local_690 >> 0x20);
    local_288 = (float)*(undefined8 *)((long)puVar1 + 0x1c);
    fStack_284 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x1c) >> 0x20);
    fStack_280 = (float)*(undefined8 *)((long)puVar1 + 0x24);
    fStack_27c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x24) >> 0x20);
    local_2a8 = (float)puVar1[5];
    fStack_2a4 = (float)((ulong)puVar1[5] >> 0x20);
    fStack_2a0 = (float)puVar1[6];
    fStack_29c = (float)((ulong)puVar1[6] >> 0x20);
    fStack_490 = (float)local_690[1];
    local_2c8 = (float)puVar1[7];
    fStack_2c4 = (float)((ulong)puVar1[7] >> 0x20);
    fStack_2c0 = (float)puVar1[8];
    fStack_2bc = (float)((ulong)puVar1[8] >> 0x20);
    local_2e8 = (float)*(undefined8 *)((long)puVar1 + 0x44);
    fStack_2e4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x44) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)((long)puVar1 + 0x4c);
    fStack_2dc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x4c) >> 0x20);
    fStack_49c = (float)((ulong)local_690[1] >> 0x20);
    local_308 = (float)*(undefined8 *)((long)puVar1 + 0x54);
    fStack_304 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x54) >> 0x20);
    fStack_300 = (float)*(undefined8 *)((long)puVar1 + 0x5c);
    fStack_2fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x5c) >> 0x20);
    local_328 = (float)puVar1[0xc];
    fStack_324 = (float)((ulong)puVar1[0xc] >> 0x20);
    fStack_320 = (float)puVar1[0xd];
    fStack_31c = (float)((ulong)puVar1[0xd] >> 0x20);
    local_4b8 = (float)local_690[2];
    local_348 = (float)puVar1[0xe];
    fStack_344 = (float)((ulong)puVar1[0xe] >> 0x20);
    fStack_340 = (float)puVar1[0xf];
    fStack_33c = (float)((ulong)puVar1[0xf] >> 0x20);
    local_368 = (float)*(undefined8 *)((long)puVar1 + 0x7c);
    fStack_364 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x7c) >> 0x20);
    fStack_360 = (float)*(undefined8 *)((long)puVar1 + 0x84);
    fStack_35c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x84) >> 0x20);
    fStack_4c4 = (float)((ulong)local_690[2] >> 0x20);
    local_388 = (float)*(undefined8 *)((long)puVar1 + 0x8c);
    fStack_384 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x8c) >> 0x20);
    fStack_380 = (float)*(undefined8 *)((long)puVar1 + 0x94);
    fStack_37c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x94) >> 0x20);
    local_3a8 = (float)puVar1[0x13];
    fStack_3a4 = (float)((ulong)puVar1[0x13] >> 0x20);
    fStack_3a0 = (float)puVar1[0x14];
    fStack_39c = (float)((ulong)puVar1[0x14] >> 0x20);
    fStack_4d0 = (float)local_690[3];
    local_3c8 = (float)puVar1[0x15];
    fStack_3c4 = (float)((ulong)puVar1[0x15] >> 0x20);
    fStack_3c0 = (float)puVar1[0x16];
    fStack_3bc = (float)((ulong)puVar1[0x16] >> 0x20);
    local_3e8 = (float)*(undefined8 *)((long)puVar1 + 0xb4);
    fStack_3e4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xb4) >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)((long)puVar1 + 0xbc);
    fStack_3dc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xbc) >> 0x20);
    fStack_4dc = (float)((ulong)local_690[3] >> 0x20);
    local_408 = (float)*(undefined8 *)((long)puVar1 + 0xc4);
    fStack_404 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc4) >> 0x20);
    fStack_400 = (float)*(undefined8 *)((long)puVar1 + 0xcc);
    fStack_3fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xcc) >> 0x20);
    local_428 = (float)puVar1[0x1a];
    fStack_424 = (float)((ulong)puVar1[0x1a] >> 0x20);
    fStack_420 = (float)puVar1[0x1b];
    fStack_41c = (float)((ulong)puVar1[0x1b] >> 0x20);
    fVar2 = *(float *)(local_690 + 4);
    local_448 = (float)puVar1[0x1c];
    fStack_444 = (float)((ulong)puVar1[0x1c] >> 0x20);
    fStack_440 = (float)puVar1[0x1d];
    fStack_43c = (float)((ulong)puVar1[0x1d] >> 0x20);
    local_468 = (float)*(undefined8 *)((long)puVar1 + 0xec);
    fStack_464 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xec) >> 0x20);
    fStack_460 = (float)*(undefined8 *)((long)puVar1 + 0xf4);
    fStack_45c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xf4) >> 0x20);
    *(ulong *)((long)local_6a8 + 0xc) =
         CONCAT44(local_478 * fStack_264 + fStack_490 * fStack_2e4 + local_4b8 * fStack_364 +
                  fStack_4d0 * fStack_3e4 + fVar2 * fStack_464 +
                  fStack_484 * fStack_2a4 + fStack_49c * fStack_324 + fStack_4c4 * fStack_3a4 +
                  fStack_4dc * fStack_424,
                  local_478 * local_268 + fStack_490 * local_2e8 + local_4b8 * local_368 +
                  fStack_4d0 * local_3e8 + fVar2 * local_468 +
                  fStack_484 * local_2a8 + fStack_49c * local_328 + fStack_4c4 * local_3a8 +
                  fStack_4dc * local_428);
    *(ulong *)((long)local_6a8 + 0x14) =
         CONCAT44(local_478 * fStack_25c + fStack_490 * fStack_2dc + local_4b8 * fStack_35c +
                  fStack_4d0 * fStack_3dc + fVar2 * fStack_45c +
                  fStack_484 * fStack_29c + fStack_49c * fStack_31c + fStack_4c4 * fStack_39c +
                  fStack_4dc * fStack_41c,
                  local_478 * fStack_260 + fStack_490 * fStack_2e0 + local_4b8 * fStack_360 +
                  fStack_4d0 * fStack_3e0 + fVar2 * fStack_460 +
                  fStack_484 * fStack_2a0 + fStack_49c * fStack_320 + fStack_4c4 * fStack_3a0 +
                  fStack_4dc * fStack_420);
    *local_6a8 = CONCAT44(local_478 * fStack_244 + fStack_490 * fStack_2c4 + local_4b8 * fStack_344
                          + fStack_4d0 * fStack_3c4 + fVar2 * fStack_444 +
                          fStack_484 * fStack_284 + fStack_49c * fStack_304 +
                          fStack_4c4 * fStack_384 + fStack_4dc * fStack_404,
                          local_478 * local_248 + fStack_490 * local_2c8 + local_4b8 * local_348 +
                          fStack_4d0 * local_3c8 + fVar2 * local_448 +
                          fStack_484 * local_288 + fStack_49c * local_308 + fStack_4c4 * local_388 +
                          fStack_4dc * local_408);
    local_6a8[1] = CONCAT44(local_478 * fStack_23c + fStack_490 * fStack_2bc +
                            local_4b8 * fStack_33c + fStack_4d0 * fStack_3bc + fVar2 * fStack_43c +
                            fStack_484 * fStack_27c + fStack_49c * fStack_2fc +
                            fStack_4c4 * fStack_37c + fStack_4dc * fStack_3fc,
                            local_478 * fStack_240 + fStack_490 * fStack_2c0 +
                            local_4b8 * fStack_340 + fStack_4d0 * fStack_3c0 + fVar2 * fStack_440 +
                            fStack_484 * fStack_280 + fStack_49c * fStack_300 +
                            fStack_4c4 * fStack_380 + fStack_4dc * fStack_400);
    local_690 = (undefined8 *)((long)local_690 + (long)in_R9D * 4);
    local_688 = local_688 + 2;
    local_6a8 = (undefined8 *)((long)local_6a8 + 0x1c);
  } while (local_6a8 < (undefined8 *)((long)in_RDI + (ulong)(uint)(in_ESI * 7) * 4));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_9_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__1_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}